

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_server.c
# Opt level: O0

int ssl_write_hello_verify_request(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  int iVar2;
  byte *pbVar3;
  uchar *cookie_len_byte;
  uchar *p;
  mbedtls_ssl_context *pmStack_18;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  p._4_4_ = 0xffffff92;
  cookie_len_byte = ssl->out_msg + 4;
  pmStack_18 = ssl;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
             ,0x801,"=> write hello verify request");
  mbedtls_ssl_write_version
            (cookie_len_byte,(uint)pmStack_18->conf->transport,pmStack_18->tls_version);
  mbedtls_debug_print_buf
            (pmStack_18,3,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
             ,0x80d,"server version",cookie_len_byte,2);
  puVar1 = cookie_len_byte;
  pbVar3 = cookie_len_byte + 2;
  if (pmStack_18->conf->f_cookie_write ==
      (_func_int_void_ptr_uchar_ptr_ptr_uchar_ptr_uchar_ptr_size_t *)0x0) {
    cookie_len_byte = pbVar3;
    mbedtls_debug_print_msg
              (pmStack_18,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
               ,0x812,"inconsistent cookie callbacks");
    ssl_local._4_4_ = -0x6c00;
  }
  else {
    cookie_len_byte = cookie_len_byte + 3;
    p._4_4_ = (*pmStack_18->conf->f_cookie_write)
                        (pmStack_18->conf->p_cookie,&cookie_len_byte,pmStack_18->out_buf + 0x42d,
                         pmStack_18->cli_id,pmStack_18->cli_id_len);
    if (p._4_4_ == 0) {
      *pbVar3 = (char)cookie_len_byte - ((char)pbVar3 + '\x01');
      mbedtls_debug_print_buf
                (pmStack_18,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                 ,0x822,"cookie sent",puVar1 + 3,(ulong)*pbVar3);
      pmStack_18->out_msglen = (long)cookie_len_byte - (long)pmStack_18->out_msg;
      pmStack_18->out_msgtype = 0x16;
      *pmStack_18->out_msg = '\x03';
      pmStack_18->state = 0x11;
      p._4_4_ = mbedtls_ssl_write_handshake_msg(pmStack_18);
      if (p._4_4_ == 0) {
        iVar2 = 0;
        if ((pmStack_18->conf->transport == '\x01') &&
           (p._4_4_ = mbedtls_ssl_flight_transmit(pmStack_18), iVar2 = p._4_4_, p._4_4_ != 0)) {
          mbedtls_debug_print_ret
                    (pmStack_18,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                     ,0x832,"mbedtls_ssl_flight_transmit",p._4_4_);
          return p._4_4_;
        }
        p._4_4_ = iVar2;
        mbedtls_debug_print_msg
                  (pmStack_18,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                   ,0x837,"<= write hello verify request");
        ssl_local._4_4_ = 0;
      }
      else {
        mbedtls_debug_print_ret
                  (pmStack_18,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                   ,0x82b,"mbedtls_ssl_write_handshake_msg",p._4_4_);
        ssl_local._4_4_ = p._4_4_;
      }
    }
    else {
      mbedtls_debug_print_ret
                (pmStack_18,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                 ,0x81c,"f_cookie_write",p._4_4_);
      ssl_local._4_4_ = p._4_4_;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_write_hello_verify_request(mbedtls_ssl_context *ssl)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *p = ssl->out_msg + 4;
    unsigned char *cookie_len_byte;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> write hello verify request"));

    /*
     * struct {
     *   ProtocolVersion server_version;
     *   opaque cookie<0..2^8-1>;
     * } HelloVerifyRequest;
     */

    /* The RFC is not clear on this point, but sending the actual negotiated
     * version looks like the most interoperable thing to do. */
    mbedtls_ssl_write_version(p, ssl->conf->transport, ssl->tls_version);
    MBEDTLS_SSL_DEBUG_BUF(3, "server version", p, 2);
    p += 2;

    /* If we get here, f_cookie_check is not null */
    if (ssl->conf->f_cookie_write == NULL) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("inconsistent cookie callbacks"));
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }

    /* Skip length byte until we know the length */
    cookie_len_byte = p++;

    if ((ret = ssl->conf->f_cookie_write(ssl->conf->p_cookie,
                                         &p, ssl->out_buf + MBEDTLS_SSL_OUT_BUFFER_LEN,
                                         ssl->cli_id, ssl->cli_id_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "f_cookie_write", ret);
        return ret;
    }

    *cookie_len_byte = (unsigned char) (p - (cookie_len_byte + 1));

    MBEDTLS_SSL_DEBUG_BUF(3, "cookie sent", cookie_len_byte + 1, *cookie_len_byte);

    ssl->out_msglen  = p - ssl->out_msg;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST;

    ssl->state = MBEDTLS_SSL_SERVER_HELLO_VERIFY_REQUEST_SENT;

    if ((ret = mbedtls_ssl_write_handshake_msg(ssl)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_write_handshake_msg", ret);
        return ret;
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        (ret = mbedtls_ssl_flight_transmit(ssl)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_flight_transmit", ret);
        return ret;
    }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= write hello verify request"));

    return 0;
}